

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Transpose<2,_4>::doApply
          (IRet *__return_storage_ptr__,Transpose<2,_4> *this,EvalContext *param_1,IArgs *iargs)

{
  bool *pbVar1;
  bool *pbVar2;
  Matrix<tcu::Interval,_4,_2> *pMVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix(__return_storage_ptr__);
  pMVar3 = iargs->a;
  lVar7 = 0;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    lVar8 = 0;
    do {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_data).m_data[0].m_data[lVar7].m_hi + lVar8 * 2) =
           *(undefined8 *)((long)&(pMVar3->m_data).m_data[lVar7].m_data[0].m_hi + lVar8);
      pbVar1 = &(pMVar3->m_data).m_data[lVar7].m_data[0].m_hasNaN + lVar8;
      dVar4 = *(double *)(pbVar1 + 8);
      pbVar2 = &(__return_storage_ptr__->m_data).m_data[0].m_data[lVar7].m_hasNaN + lVar8 * 2;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar4;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x60);
    lVar7 = 1;
    bVar5 = false;
  } while (bVar6);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		IRet ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
		{
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = iargs.a(colNdx, rowNdx);
		}

		return ret;
	}